

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool i386_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cpu,CPUBreakpoint *bp)

{
  target_ulong tVar1;
  long lVar2;
  TCGContext *tcg_ctx;
  TCGContext *tcg_ctx_00;
  uint uVar3;
  TCGTemp *local_30;
  
  uVar3 = ((uint)((dcbase->tb->flags & 0x10000) == 0) << 5 | 0x10) & bp->flags;
  if (uVar3 != 0) {
    tVar1 = dcbase->pc_next;
    lVar2 = *(long *)&dcbase[1].max_insns;
    tcg_ctx = *(TCGContext **)(dcbase[0xc].pc_next + 0x2e8);
    gen_update_cc_op((DisasContext *)dcbase);
    tcg_ctx_00 = *(TCGContext **)(dcbase[0xc].pc_next + 0x2e8);
    tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_movi_i64,(long)&tcg_ctx_00->pool_cur + (long)dcbase[6].tb
                       ,tVar1 - lVar2);
    tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_st_i64,(long)&tcg_ctx_00->pool_cur + (long)dcbase[6].tb,
                       (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x80);
    local_30 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_x86_64(tcg_ctx,helper_debug_x86_64,(TCGTemp *)0x0,1,&local_30);
    dcbase->is_jmp = DISAS_NORETURN;
    dcbase->pc_next = dcbase->pc_next + 1;
  }
  return uVar3 != 0;
}

Assistant:

static bool i386_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cpu,
                                     const CPUBreakpoint *bp)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);

    /* If RF is set, suppress an internally generated breakpoint.  */
    int flags = dc->base.tb->flags & HF_RF_MASK ? BP_GDB : BP_ANY;
    if (bp->flags & flags) {
        gen_debug(dc, dc->base.pc_next - dc->cs_base);
        dc->base.is_jmp = DISAS_NORETURN;
        /* The address covered by the breakpoint must be included in
           [tb->pc, tb->pc + tb->size) in order to for it to be
           properly cleared -- thus we increment the PC here so that
           the generic logic setting tb->size later does the right thing.  */
        dc->base.pc_next += 1;
        return true;
    } else {
        return false;
    }
}